

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>::truncate
          (ArrayBuilder<kj::MainBuilder::Impl::Arg> *this,char *__file,__off_t __length)

{
  Arg *pAVar1;
  Iface *pIVar2;
  Disposer *pDVar3;
  Arg *pAVar4;
  Arg *pAVar5;
  
  pAVar1 = this->ptr;
  pAVar5 = this->pos;
  while (pAVar4 = pAVar5, pAVar1 + (long)__file < pAVar4) {
    this->pos = pAVar4 + -1;
    pIVar2 = pAVar4[-1].callback.impl.ptr;
    pAVar5 = pAVar4 + -1;
    if (pIVar2 != (Iface *)0x0) {
      pAVar4[-1].callback.impl.ptr = (Iface *)0x0;
      pDVar3 = pAVar4[-1].callback.impl.disposer;
      (**pDVar3->_vptr_Disposer)(pDVar3,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
      pAVar5 = this->pos;
    }
  }
  return (int)pAVar4;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }